

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_tips.cpp
# Opt level: O0

vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *
handlegraph::algorithms::head_nodes(HandleGraph *g)

{
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_RDI;
  undefined1 unaff_retaddr;
  anon_class_16_2_9ff080d6 *in_stack_00000008;
  HandleGraph *in_stack_00000010;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *to_return;
  
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x24a564);
  HandleGraph::
  for_each_handle<handlegraph::algorithms::head_nodes(handlegraph::HandleGraph_const*)::__0>
            (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  return in_RDI;
}

Assistant:

vector<handle_t> head_nodes(const HandleGraph* g) {
    vector<handle_t> to_return;
    g->for_each_handle([&](const handle_t& found) {
        // For each (locally forward) node
        
        bool no_left_edges = true;
        g->follow_edges(found, true, [&](const handle_t& ignored) {
            // We found a left edge!
            no_left_edges = false;
            // We only need one
            return false;
        });
        
        if (no_left_edges) {
            to_return.push_back(found);
        }
    });
    
    return to_return;
    
}